

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O0

bool __thiscall
so_5::env_infrastructures::st_reusable_stuff::coop_repo_t::has_live_coop(coop_repo_t *this)

{
  bool bVar1;
  mutex *__m;
  bool local_19;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  coop_repo_t *this_local;
  
  l._M_device = (mutex_type *)this;
  __m = so_5::impl::coop_repository_basis_t::lock(&this->super_coop_repository_basis_t);
  std::lock_guard<std::mutex>::lock_guard(&local_18,__m);
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
          ::empty(&(this->super_coop_repository_basis_t).m_registered_coop);
  local_19 = false;
  if (bVar1) {
    local_19 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
               ::empty(&(this->super_coop_repository_basis_t).m_deregistered_coop);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return (bool)((local_19 ^ 0xffU) & 1);
}

Assistant:

bool
		has_live_coop()
			{
				// A lock is necessary here because coop_repo can be used
				// in thread-safe environment where access to environment from
				// different thread is allowed.
				std::lock_guard< std::mutex > l{ lock() };
				return !( m_registered_coop.empty() && m_deregistered_coop.empty() );
			}